

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall Json::StyledWriter::writeCommentBeforeValue(StyledWriter *this,Value *root)

{
  bool bVar1;
  bool bVar2;
  reference pcVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68 [3];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  const_iterator iter;
  String *comment;
  Value *root_local;
  StyledWriter *this_local;
  
  bVar1 = Value::hasComment(root,commentBefore);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)&this->document_,'\n');
    writeIndent(this);
    Value::getComment_abi_cxx11_((String *)&iter,root,commentBefore);
    local_48._M_current = (char *)std::__cxx11::string::begin();
    while( true ) {
      local_50._M_current = (char *)std::__cxx11::string::end();
      bVar1 = __gnu_cxx::operator!=(&local_48,&local_50);
      if (!bVar1) break;
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_48);
      std::__cxx11::string::operator+=((string *)&this->document_,*pcVar3);
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_48);
      bVar1 = false;
      if (*pcVar3 == '\n') {
        local_68[0] = __gnu_cxx::
                      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator+(&local_48,1);
        local_70._M_current = (char *)std::__cxx11::string::end();
        bVar2 = __gnu_cxx::operator!=(local_68,&local_70);
        bVar1 = false;
        if (bVar2) {
          local_78 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator+(&local_48,1);
          pcVar3 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_78);
          bVar1 = *pcVar3 == '/';
        }
      }
      if (bVar1) {
        writeIndent(this);
      }
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_48);
    }
    std::__cxx11::string::operator+=((string *)&this->document_,'\n');
    std::__cxx11::string::~string((string *)&iter);
  }
  return;
}

Assistant:

void StyledWriter::writeCommentBeforeValue(const Value& root) {
  if (!root.hasComment(commentBefore))
    return;

  document_ += '\n';
  writeIndent();
  const String& comment = root.getComment(commentBefore);
  String::const_iterator iter = comment.begin();
  while (iter != comment.end()) {
    document_ += *iter;
    if (*iter == '\n' && ((iter + 1) != comment.end() && *(iter + 1) == '/'))
      writeIndent();
    ++iter;
  }

  // Comments are stripped of trailing newlines, so add one here
  document_ += '\n';
}